

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::c_input_test_5ints::c_input_test_5ints(c_input_test_5ints *this)

{
  c_input_test_5ints *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture =
       (_func_int **)&PTR__c_input_test_5ints_0032e740;
  return;
}

Assistant:

void test()
      {
      std::stringstream str, str2;
      std::string script = R"(
(c-input "(int a, int b, int c, int d, int e) " )

(+ a b c d e)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          uint64_t res = f(&ctxt, (int64_t)3, (int64_t)4, (int64_t)5, (int64_t)6, (int64_t)7);
          scheme_runtime(res, str, env, rd, nullptr);

          uint64_t res2 = f(&ctxt, (int64_t)101, (int64_t)4, (int64_t)0, (int64_t)0, (int64_t)1);
          scheme_runtime(res2, str2, env, rd, nullptr);

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("25", str.str());
      TEST_EQ("106", str2.str());
      }